

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O1

void __thiscall VGMPlayer::Cmd_CPort_Reg8_Data8(VGMPlayer *this)

{
  UINT8 UVar1;
  UINT8 *pUVar2;
  CHIP_DEVICE *pCVar3;
  ulong uVar4;
  byte bVar5;
  
  pCVar3 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                        0x9f < (ulong)this->_fileData[this->_filePos]);
  if ((pCVar3 != (CHIP_DEVICE *)0x0) && (pCVar3->write8 != (DEVFUNC_WRITE_A8D8)0x0)) {
    pUVar2 = this->_fileData;
    uVar4 = (ulong)this->_filePos;
    UVar1 = pUVar2[uVar4 + 2];
    bVar5 = pUVar2[uVar4] * '\x02' & 2;
    (*pCVar3->write8)((pCVar3->base).defInf.dataPtr,bVar5,pUVar2[uVar4 + 1]);
    (*pCVar3->write8)((pCVar3->base).defInf.dataPtr,bVar5 + 1,UVar1);
    return;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_CPort_Reg8_Data8(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x00] >= 0xA0) ? 1 : 0;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	
	SendYMCommand(cDev, fData[0x00] & 0x01, fData[0x01], fData[0x02]);
	return;
}